

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p256_test.cc
# Opt level: O2

void __thiscall P256Test_AdxSquareABI_Test::TestBody(P256Test_AdxSquareABI_Test *this)

{
  int iVar1;
  AssertHelper local_38;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_30;
  uint64_t out [4];
  
  iVar1 = CRYPTO_is_BMI1_capable();
  if (((iVar1 != 0) && (iVar1 = CRYPTO_is_BMI2_capable(), iVar1 != 0)) &&
     (iVar1 = CRYPTO_is_ADX_capable(), iVar1 != 0)) {
    abi_test::internal::CheckGTest<void,unsigned_long*,unsigned_long_const*>
              ("fiat_p256_adx_sqr, out, in",
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/p256_test.cc"
               ,0x2a,true,fiat_p256_adx_sqr,out,TestBody::in);
    return;
  }
  testing::Message::Message((Message *)&local_30);
  std::operator<<((ostream *)(local_30._M_head_impl + 0x10),
                  "Can\'t test ABI of ADX code without ADX");
  testing::internal::AssertHelper::AssertHelper
            (&local_38,kSkip,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/p256_test.cc"
             ,0x2c,"");
  testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_30);
  testing::internal::AssertHelper::~AssertHelper(&local_38);
  if (local_30._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_30._M_head_impl + 8))();
  }
  return;
}

Assistant:

TEST(P256Test, AdxSquareABI) {
  static const uint64_t in[4] = {0};
  uint64_t out[4];
  if (CRYPTO_is_BMI1_capable() && CRYPTO_is_BMI2_capable() &&
      CRYPTO_is_ADX_capable()) {
    CHECK_ABI(fiat_p256_adx_sqr, out, in);
  } else {
    GTEST_SKIP() << "Can't test ABI of ADX code without ADX";
  }
}